

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-sha512.c
# Opt level: O2

_Bool ed25519_verify(uint8_t *sig,uint8_t *pub,uint8_t *data,size_t len)

{
  int iVar1;
  sc_t S;
  uint8_t check [32];
  sc_t t;
  ed A;
  uint8_t h [64];
  ed C;
  sha512 hash;
  
  ed_import(&A,pub);
  sc_import(S,sig + 0x20,0x20);
  sha512_init(&hash);
  sha512_add(&hash,sig,0x20);
  sha512_add(&hash,pub,0x20);
  sha512_add(&hash,data,len);
  sha512_final(&hash,h);
  sc_import(t,h,0x40);
  fld_neg(A.x,A.x);
  fld_neg(A.t,A.t);
  ed_dual_scale(&C,S,t,&A);
  ed_export(check,&C);
  iVar1 = bcmp(check,sig,0x20);
  return iVar1 == 0;
}

Assistant:

bool
ed25519_verify(const uint8_t sig[ED25519_SIG_LEN],
	       const uint8_t pub[ED25519_KEY_LEN],
	       const uint8_t *data, size_t len)
{
	struct sha512 hash;
	uint8_t h[SHA512_HASH_LENGTH];
	struct ed A, C;
	sc_t t, S;
	uint8_t check[32];

	/* import public key */
	ed_import(&A, pub);

	/* import S from second half of the signature */
	sc_import(S, sig+32, 32);

	/* calculate t := Hash(export(R), export(A), data) mod m */
	sha512_init(&hash);
	sha512_add(&hash, sig, 32);
	sha512_add(&hash, pub, 32);
	sha512_add(&hash, data, len);
	sha512_final(&hash, h);
	sc_import(t, h, 64);

	/* verify signature (vartime!) */
	fld_neg(A.x, A.x);
	fld_neg(A.t, A.t);
	ed_dual_scale(&C, S, t, &A);
	ed_export(check, &C);
	
	/* is export(C) == export(R) (vartime!) */
	return (memcmp(check, sig, 32) == 0);
}